

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_variantSelectionMap
                   (string *__return_storage_ptr__,VariantSelectionMap *m,uint32_t indent)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  string local_278;
  allocator local_251;
  string local_250;
  string local_230;
  string local_210;
  reference local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  VariantSelectionMap *__range1;
  undefined4 local_1ac;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  VariantSelectionMap *pVStack_18;
  uint32_t indent_local;
  VariantSelectionMap *m_local;
  
  local_1c = indent;
  pVStack_18 = m;
  m_local = (VariantSelectionMap *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(pVStack_18);
  if (bVar1) {
    std::__cxx11::stringstream::str();
  }
  else {
    pprint::Indent_abi_cxx11_((string *)&__range1,(pprint *)(ulong)local_1c,n);
    poVar2 = std::operator<<(aoStack_198,(string *)&__range1);
    std::operator<<(poVar2,"variants = {\n");
    std::__cxx11::string::~string((string *)&__range1);
    this = pVStack_18;
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pVStack_18);
    item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(this);
    while( true ) {
      bVar1 = std::operator!=(&__end1,(_Self *)&item);
      if (!bVar1) break;
      local_1f0 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(&__end1);
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)(ulong)(local_1c + 1),n_01);
      poVar2 = std::operator<<(aoStack_198,(string *)&local_210);
      poVar2 = std::operator<<(poVar2,"string ");
      poVar2 = std::operator<<(poVar2,(string *)local_1f0);
      poVar2 = std::operator<<(poVar2," = ");
      s = &local_1f0->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"\"",&local_251);
      quote(&local_230,s,&local_250);
      poVar2 = std::operator<<(poVar2,(string *)&local_230);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      std::__cxx11::string::~string((string *)&local_210);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    pprint::Indent_abi_cxx11_(&local_278,(pprint *)(ulong)local_1c,n_00);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_278);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::stringstream::str();
  }
  local_1ac = 1;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_variantSelectionMap(const VariantSelectionMap &m,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (m.empty()) {
    return ss.str();
  }

  ss << pprint::Indent(indent) << "variants = {\n";
  for (const auto &item : m) {
    ss << pprint::Indent(indent + 1) << "string " << item.first << " = "
       << quote(item.second) << "\n";
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}